

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *centre,float radius,float a_min,float a_max,int num_segments)

{
  float fVar1;
  float fVar2;
  ImVec2 *pIVar3;
  ImVec2 *pIVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  
  iVar7 = (this->_Path).Size;
  if ((radius != 0.0) || (NAN(radius))) {
    iVar7 = num_segments + iVar7 + 1;
    if ((this->_Path).Capacity < iVar7) {
      pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        memcpy(pIVar4,pIVar3,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar4;
      (this->_Path).Capacity = iVar7;
    }
    if (-1 < num_segments) {
      iVar7 = 0;
      do {
        fVar10 = ((float)iVar7 / (float)num_segments) * (a_max - a_min) + a_min;
        fVar1 = centre->x;
        fVar9 = cosf(fVar10);
        fVar2 = centre->y;
        fVar10 = sinf(fVar10);
        iVar8 = (this->_Path).Size;
        iVar5 = (this->_Path).Capacity;
        if (iVar8 == iVar5) {
          if (iVar5 == 0) {
            iVar6 = 8;
          }
          else {
            iVar6 = iVar5 / 2 + iVar5;
          }
          iVar8 = iVar8 + 1;
          if (iVar8 < iVar6) {
            iVar8 = iVar6;
          }
          if (iVar5 < iVar8) {
            pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
            pIVar3 = (this->_Path).Data;
            if (pIVar3 != (ImVec2 *)0x0) {
              memcpy(pIVar4,pIVar3,(long)(this->_Path).Size << 3);
              ImGui::MemFree((this->_Path).Data);
            }
            (this->_Path).Data = pIVar4;
            (this->_Path).Capacity = iVar8;
          }
        }
        pIVar3 = (this->_Path).Data;
        iVar8 = (this->_Path).Size;
        pIVar3[iVar8].x = fVar9 * radius + fVar1;
        pIVar3[iVar8].y = fVar10 * radius + fVar2;
        (this->_Path).Size = (this->_Path).Size + 1;
        iVar7 = iVar7 + 1;
      } while (num_segments + 1 != iVar7);
    }
  }
  else {
    iVar8 = (this->_Path).Capacity;
    if (iVar7 == iVar8) {
      if (iVar8 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar8 / 2 + iVar8;
      }
      iVar6 = iVar7 + 1;
      if (iVar7 + 1 < iVar5) {
        iVar6 = iVar5;
      }
      if (iVar8 < iVar6) {
        pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar4,pIVar3,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar4;
        (this->_Path).Capacity = iVar6;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *centre;
    (this->_Path).Size = (this->_Path).Size + 1;
  }
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& centre, float radius, float a_min, float a_max, int num_segments)
{
    if (radius == 0.0f)
    {
        _Path.push_back(centre);
        return;
    }

    // Note that we are adding a point at both a_min and a_max.
    // If you are trying to draw a full closed circle you don't want the overlapping points!
    _Path.reserve(_Path.Size + (num_segments + 1));
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = a_min + ((float)i / (float)num_segments) * (a_max - a_min);
        _Path.push_back(ImVec2(centre.x + ImCos(a) * radius, centre.y + ImSin(a) * radius));
    }
}